

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

pseudo_t linearize_statement(dmr_C *C,entrypoint *ep,statement *stmt)

{
  allocator *paVar1;
  uint uVar2;
  statement *psVar3;
  statement *stmt_00;
  statement *stmt_01;
  expression *expr;
  position pVar4;
  linearizer_state_t *plVar5;
  expression_list *peVar6;
  statement_list *psVar7;
  undefined4 *puVar8;
  pseudo_t ppVar9;
  undefined8 *puVar10;
  pseudo_t ppVar11;
  pseudo_t *pp;
  basic_block *pbVar12;
  basic_block *pbVar13;
  void **ppvVar14;
  symbol *psVar15;
  scope *psVar16;
  expression *peVar17;
  undefined8 *puVar18;
  instruction *piVar19;
  basic_block *pbVar20;
  int iVar21;
  symbol *psVar22;
  symbol *psVar23;
  ptr_list_iter local_b0;
  undefined1 auStack_98 [8];
  ptr_list_iter symiter__;
  basic_block *local_58;
  expression *local_50;
  basic_block *local_48;
  expression *local_40;
  
LAB_0013065b:
  if (stmt == (statement *)0x0) goto switchD_001306ca_caseD_9;
  pbVar13 = ep->active;
  if ((pbVar13 != (basic_block *)0x0) && (pbVar13->insns == (instruction_list *)0x0)) {
    pbVar13->pos = stmt->pos;
  }
  C->L->current_pos = stmt->pos;
  if (stmt->type == STMT_LABEL) goto code_r0x00130692;
  switch(stmt->type) {
  case STMT_DECLARATION:
    ptrlist_concat((ptr_list *)(stmt->field_2).field_1.expression,(ptr_list **)&ep->syms);
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_1.expression);
    while (psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98),
          psVar15 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar15);
    }
    goto switchD_001306ca_caseD_9;
  case STMT_EXPRESSION:
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    return ppVar9;
  case STMT_COMPOUND:
    if ((stmt->field_2).field_3.if_false == (statement *)0x0) {
      ppVar9 = linearize_compound_statement(C,ep,stmt);
      return ppVar9;
    }
    puVar8 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar8 = 0x34;
    *(position *)(puVar8 + 4) = C->L->current_pos;
    peVar6 = (stmt->field_2).field_10.asm_clobbers;
    if (peVar6 != (expression_list *)0x0) {
      ptrlist_concat((ptr_list *)peVar6->next_,(ptr_list **)&ep->syms);
      ptrlist_forward_iterator((ptr_list_iter *)auStack_98,(ptr_list *)peVar6->next_);
      psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (psVar15 != (symbol *)0x0) {
        do {
          ppVar9 = linearize_one_symbol(C,ep,psVar15);
          ppvVar14 = ptrlist_add((ptr_list **)(puVar8 + 0xc),ppVar9,&C->ptrlist_allocator);
          *ppvVar14 = ppVar9;
          if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) &&
             (ppVar9->type != PSEUDO_VAL)) {
            puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
            puVar10[1] = ppvVar14;
            *puVar10 = puVar8;
            ptrlist_add((ptr_list **)&ppVar9->users,puVar10,&C->ptrlist_allocator);
          }
          psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (psVar15 != (symbol *)0x0);
      }
    }
    ppVar9 = linearize_compound_statement(C,ep,stmt);
    *(pseudo_t *)(puVar8 + 8) = ppVar9;
    ppVar11 = symbol_pseudo(C,ep,(stmt->field_2).field_4.inline_fn);
    *(pseudo_t *)(puVar8 + 10) = ppVar11;
    if (((ppVar11 != (pseudo_t)0x0) && (ppVar11->type != PSEUDO_VOID)) &&
       (ppVar11->type != PSEUDO_VAL)) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = puVar8 + 10;
      *puVar10 = puVar8;
      ptrlist_add((ptr_list **)&ppVar11->users,puVar10,&C->ptrlist_allocator);
    }
    pbVar13 = ep->active;
    if ((pbVar13 != (basic_block *)0x0) && (pbVar13->insns == (instruction_list *)0x0)) {
      pbVar13->pos = stmt->pos;
    }
    pbVar13 = ep->active;
    if (pbVar13 == (basic_block *)0x0) {
      return ppVar9;
    }
    *(basic_block **)(puVar8 + 2) = pbVar13;
    ptrlist_add((ptr_list **)&pbVar13->insns,puVar8,&C->ptrlist_allocator);
    return ppVar9;
  case STMT_IF:
    pVar4 = stmt->pos;
    peVar17 = (stmt->field_2).field_1.expression;
    pbVar13 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar13->context = -1;
    pbVar13->pos = pVar4;
    pbVar13->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar13->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar20 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar20->context = -1;
    pbVar20->pos = pVar4;
    pbVar20->ep = ep;
    uVar2 = C->L->bb_nr;
    C->L->bb_nr = uVar2 + 1;
    pbVar20->nr = uVar2;
    linearize_cond_branch(C,ep,peVar17,pbVar13,pbVar20);
    set_activeblock(C,ep,pbVar13);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
    pbVar13 = pbVar20;
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      pVar4 = stmt->pos;
      pbVar13 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
      pbVar13->context = -1;
      pbVar13->pos = pVar4;
      pbVar13->ep = ep;
      uVar2 = C->L->bb_nr;
      C->L->bb_nr = uVar2 + 1;
      pbVar13->nr = uVar2;
      add_goto(C,ep,pbVar13);
      set_activeblock(C,ep,pbVar20);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    }
    goto LAB_0013150b;
  case STMT_RETURN:
    peVar17 = (stmt->field_2).field_1.expression;
    pbVar13 = get_bound_block(C,ep,(stmt->field_2).field_2.ret_target);
    ppVar9 = linearize_expression(C,ep,peVar17);
    pbVar20 = ep->active;
    if ((pbVar20 != (basic_block *)0x0) && (ppVar9 != &C->L->void_pseudo)) {
      piVar19 = (instruction *)ptrlist_first((ptr_list *)pbVar13->insns);
      if (piVar19 == (instruction *)0x0) {
        piVar19 = alloc_typed_instruction(C,0x2e,peVar17->ctype);
        ppVar11 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
        ppVar11->type = PSEUDO_REG;
        iVar21 = C->L->nr + 1;
        C->L->nr = iVar21;
        ppVar11->nr = iVar21;
        (ppVar11->field_5).def = piVar19;
        (piVar19->field_5).target = ppVar11;
        piVar19->bb = pbVar13;
        ptrlist_add((ptr_list **)&pbVar13->insns,piVar19,&C->ptrlist_allocator);
      }
      ppVar9 = dmrC_alloc_phi(C,pbVar20,ppVar9,peVar17->ctype);
      ppVar9->ident = C->S->return_ident;
      pp = (pseudo_t *)
           ptrlist_add((ptr_list **)&(piVar19->field_6).field_0,ppVar9,&C->ptrlist_allocator);
      dmrC_use_pseudo(C,piVar19,ppVar9,pp);
    }
    break;
  case STMT_CASE:
    add_label(C,ep,(stmt->field_2).field_6.case_label);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    goto switchD_001306ca_caseD_9;
  case STMT_SWITCH:
    pVar4 = stmt->pos;
    pbVar20 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar20->context = -1;
    pbVar20->pos = pVar4;
    pbVar20->ep = ep;
    uVar2 = C->L->bb_nr;
    C->L->bb_nr = uVar2 + 1;
    pbVar20->nr = uVar2;
    peVar17 = (stmt->field_2).field_1.expression;
    ppVar9 = linearize_expression(C,ep,peVar17);
    pbVar13 = ep->active;
    if (pbVar13 != (basic_block *)0x0) {
      piVar19 = alloc_typed_instruction(C,5,peVar17->ctype);
      (piVar19->field_5).target = ppVar9;
      if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) &&
         (ppVar9->type != PSEUDO_VAL)) {
        puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
        puVar10[1] = &piVar19->field_5;
        *puVar10 = piVar19;
        ptrlist_add((ptr_list **)&ppVar9->users,puVar10,&C->ptrlist_allocator);
      }
      pbVar12 = ep->active;
      if (pbVar12 != (basic_block *)0x0) {
        piVar19->bb = pbVar12;
        ptrlist_add((ptr_list **)&pbVar12->insns,piVar19,&C->ptrlist_allocator);
      }
      if (ep->active != (basic_block *)0x0) {
        ep->active = (basic_block *)0x0;
      }
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_98,
                 (ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
      psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (psVar15 == (symbol *)0x0) {
        local_58 = (basic_block *)0x0;
      }
      else {
        paVar1 = &C->ptrlist_allocator;
        local_58 = (basic_block *)0x0;
        do {
          psVar3 = (psVar15->field_14).field_2.stmt;
          pbVar12 = get_bound_block(C,ep,psVar15);
          psVar7 = (psVar3->field_2).field_4.stmts;
          if (psVar7 != (statement_list *)0x0) {
            psVar15 = (symbol *)psVar7->list_[0];
            psVar22 = (psVar3->field_2).field_2.ret_target;
            psVar23 = psVar15;
            if (psVar22 != (symbol *)0x0) {
              psVar23 = psVar22->next_id;
            }
            puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
            *puVar10 = pbVar12;
            psVar22 = psVar23;
            if ((long)psVar15 < (long)psVar23) {
              psVar22 = psVar15;
            }
            if ((long)psVar23 < (long)psVar15) {
              psVar23 = psVar15;
            }
            puVar10[1] = psVar22;
            puVar10[2] = psVar23;
            ptrlist_add((ptr_list **)&(piVar19->field_6).field_0,puVar10,paVar1);
            ptrlist_add((ptr_list **)&pbVar12->parents,pbVar13,paVar1);
            ptrlist_add((ptr_list **)&pbVar13->children,pbVar12,paVar1);
            pbVar12 = local_58;
          }
          local_58 = pbVar12;
          psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (psVar15 != (symbol *)0x0);
      }
      bind_label(C,(stmt->field_2).field_4.inline_fn,pbVar20,stmt->pos);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
      set_activeblock(C,ep,pbVar20);
      if (local_58 != (basic_block *)0x0) {
        pbVar20 = local_58;
      }
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
      *puVar10 = pbVar20;
      puVar10[1] = 1;
      puVar10[2] = 0;
      paVar1 = &C->ptrlist_allocator;
      ptrlist_add((ptr_list **)&(piVar19->field_6).field_0,puVar10,paVar1);
      ptrlist_add((ptr_list **)&pbVar20->parents,pbVar13,paVar1);
      ptrlist_add((ptr_list **)&pbVar13->children,pbVar20,paVar1);
      ptrlist_sort((ptr_list **)&(piVar19->field_6).field_0,C,multijmp_cmp);
    }
    goto switchD_001306ca_caseD_9;
  case STMT_ITERATOR:
    psVar3 = (stmt->field_2).field_4.args;
    peVar17 = (stmt->field_2).field_8.iterator_pre_condition;
    stmt_00 = (stmt->field_2).field_8.iterator_statement;
    stmt_01 = (stmt->field_2).field_8.iterator_post_statement;
    expr = (stmt->field_2).field_8.iterator_post_condition;
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
    while (psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98),
          psVar15 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar15);
    }
    ptrlist_concat((ptr_list *)(stmt->field_2).field_3.if_false,(ptr_list **)&ep->syms);
    linearize_statement(C,ep,psVar3);
    pVar4 = stmt->pos;
    pbVar20 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar20->context = -1;
    pbVar20->pos = pVar4;
    pbVar20->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar20->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar12 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar12->context = -1;
    pbVar12->pos = pVar4;
    pbVar12->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar12->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar13 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar13->context = -1;
    pbVar13->pos = pVar4;
    pbVar13->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar13->nr = uVar2;
    local_48 = pbVar20;
    if (expr == (expression *)0x0) {
      pVar4 = stmt->pos;
      local_48 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
      local_48->context = -1;
      local_48->pos = pVar4;
      local_48->ep = ep;
      uVar2 = C->L->bb_nr;
      C->L->bb_nr = uVar2 + 1;
      local_48->nr = uVar2;
      set_activeblock(C,ep,local_48);
    }
    if (peVar17 != (expression *)0x0) {
      linearize_cond_branch(C,ep,peVar17,pbVar20,pbVar13);
    }
    bind_label(C,(stmt->field_2).field_2.ret_target,pbVar12,stmt->pos);
    bind_label(C,(stmt->field_2).field_5.label_identifier,pbVar13,stmt->pos);
    set_activeblock(C,ep,pbVar20);
    linearize_statement(C,ep,stmt_00);
    add_goto(C,ep,pbVar12);
    set_activeblock(C,ep,pbVar12);
    linearize_statement(C,ep,stmt_01);
    if (expr == (expression *)0x0) {
      add_goto(C,ep,local_48);
    }
    else {
      linearize_cond_branch(C,ep,expr,local_48,pbVar13);
    }
LAB_0013150b:
    set_activeblock(C,ep,pbVar13);
switchD_001306ca_caseD_9:
    return &C->L->void_pseudo;
  default:
    goto switchD_001306ca_caseD_9;
  case STMT_GOTO:
    pbVar13 = ep->active;
    if (pbVar13 == (basic_block *)0x0) goto switchD_001306ca_caseD_9;
    psVar15 = (stmt->field_2).field_5.label_identifier;
    if (psVar15 == (symbol *)0x0) {
      peVar17 = (stmt->field_2).field_1.context;
      if (peVar17 == (expression *)0x0) goto switchD_001306ca_caseD_9;
      if (*(char *)peVar17 != '\x17') {
        ppVar9 = linearize_expression(C,ep,peVar17);
        piVar19 = (instruction *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
        *(undefined4 *)piVar19 = 7;
        piVar19->pos = C->L->current_pos;
        dmrC_use_pseudo(C,piVar19,ppVar9,&(piVar19->field_5).target);
        pbVar20 = ep->active;
        if (pbVar20 != (basic_block *)0x0) {
          piVar19->bb = pbVar20;
          ptrlist_add((ptr_list **)&pbVar20->insns,piVar19,&C->ptrlist_allocator);
        }
        ptrlist_forward_iterator
                  ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
        psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        if (psVar15 != (symbol *)0x0) {
          paVar1 = &C->ptrlist_allocator;
          do {
            pbVar20 = get_bound_block(C,ep,psVar15);
            puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
            *puVar10 = pbVar20;
            puVar10[1] = 1;
            puVar10[2] = 0;
            ptrlist_add((ptr_list **)&(piVar19->field_6).field_0,puVar10,paVar1);
            ptrlist_add((ptr_list **)&pbVar20->parents,ep->active,paVar1);
            ptrlist_add((ptr_list **)&pbVar13->children,pbVar20,paVar1);
            psVar15 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
          } while (psVar15 != (symbol *)0x0);
        }
        if (ep->active != (basic_block *)0x0) {
          ep->active = (basic_block *)0x0;
        }
        goto switchD_001306ca_caseD_9;
      }
      psVar15 = (peVar17->field_5).field_4.symbol;
    }
    pbVar13 = get_bound_block(C,ep,psVar15);
    break;
  case STMT_ASM:
    psVar15 = (symbol *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *(undefined4 *)psVar15 = 0x3d;
    *(position *)&(psVar15->endpos).field_0x4 = C->L->current_pos;
    psVar7 = (stmt->field_2).field_4.stmts;
    if ((psVar7 == (statement_list *)0x0) || (*(char *)psVar7 != '\x02')) {
      dmrC_warning(C,stmt->pos,"expected string in inline asm");
    }
    else {
      psVar15->replace = (symbol *)&psVar7->list_[1]->pos;
      iVar21 = 0;
      psVar16 = (scope *)dmrC_allocator_allocate(&C->L->asm_rules_allocator,0);
      psVar15->scope = psVar16;
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
      peVar17 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (peVar17 != (expression *)0x0) {
        local_50 = (expression *)0x0;
        local_40 = (expression *)0x0;
        do {
          if (iVar21 == 0) {
            iVar21 = 1;
            local_50 = peVar17;
          }
          else if (iVar21 == 2) {
            ppVar9 = linearize_expression(C,ep,peVar17);
            puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
            puVar10[2] = local_50;
            puVar10[1] = local_40;
            *puVar10 = ppVar9;
            if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) &&
               (ppVar9->type != PSEUDO_VAL)) {
              puVar18 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
              puVar18[1] = puVar10;
              *puVar18 = psVar15;
              ptrlist_add((ptr_list **)&ppVar9->users,puVar18,&C->ptrlist_allocator);
            }
            ptrlist_add((ptr_list **)psVar15->scope,puVar10,&C->ptrlist_allocator);
            iVar21 = 0;
          }
          else {
            local_40 = (expression *)((long)&((peVar17->field_5).field_4.symbol_name)->next + 4);
            iVar21 = 2;
          }
          peVar17 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (peVar17 != (expression *)0x0);
      }
      pbVar13 = ep->active;
      if (pbVar13 != (basic_block *)0x0) {
        *(basic_block **)&(psVar15->pos).field_0x4 = pbVar13;
        ptrlist_add((ptr_list **)&pbVar13->insns,psVar15,&C->ptrlist_allocator);
      }
      ptrlist_forward_iterator(&local_b0,(ptr_list *)(stmt->field_2).field_1.context);
      peVar17 = (expression *)ptrlist_iter_next(&local_b0);
      if (peVar17 != (expression *)0x0) {
        local_40 = (expression *)0x0;
        local_50 = (expression *)0x0;
        iVar21 = 0;
        do {
          if (iVar21 == 0) {
            iVar21 = 1;
            local_40 = peVar17;
          }
          else if (iVar21 == 2) {
            ppVar9 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
            ppVar9->type = PSEUDO_REG;
            iVar21 = C->L->nr + 1;
            C->L->nr = iVar21;
            ppVar9->nr = iVar21;
            (ppVar9->field_5).sym = psVar15;
            auStack_98 = (undefined1  [8])0x0;
            symiter__.__head = (ptr_list *)0x0;
            symiter__.__list = (ptr_list *)0x0;
            symiter__.__nr = 0;
            symiter__._20_4_ = 0;
            iVar21 = linearize_address_gen(C,ep,peVar17,(access_data *)auStack_98);
            if (iVar21 != 0) {
              linearize_store_gen(C,ep,ppVar9,(access_data *)auStack_98);
              puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
              puVar10[2] = local_40;
              puVar10[1] = local_50;
              *puVar10 = ppVar9;
              if ((ppVar9->type != PSEUDO_VOID) && (ppVar9->type != PSEUDO_VAL)) {
                puVar18 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
                puVar18[1] = puVar10;
                *puVar18 = psVar15;
                ptrlist_add((ptr_list **)&ppVar9->users,puVar18,&C->ptrlist_allocator);
              }
              ptrlist_add((ptr_list **)&psVar15->scope->symbols,puVar10,&C->ptrlist_allocator);
            }
            iVar21 = 0;
          }
          else {
            local_50 = (expression *)((long)&((peVar17->field_5).field_4.symbol_name)->next + 4);
            iVar21 = 2;
          }
          peVar17 = (expression *)ptrlist_iter_next(&local_b0);
        } while (peVar17 != (expression *)0x0);
      }
    }
    goto switchD_001306ca_caseD_9;
  case STMT_CONTEXT:
    iVar21 = 0;
    puVar8 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar8 = 0x3e;
    *(position *)(puVar8 + 4) = C->L->current_pos;
    peVar17 = (stmt->field_2).field_1.expression;
    if (*(char *)peVar17 == '\x01') {
      iVar21 = (peVar17->field_5).field_2.wide;
    }
    puVar8[10] = iVar21;
    *(expression **)(puVar8 + 0xc) = (stmt->field_2).field_1.context;
    pbVar13 = ep->active;
    if (pbVar13 != (basic_block *)0x0) {
      *(basic_block **)(puVar8 + 2) = pbVar13;
      goto LAB_001314d5;
    }
    goto switchD_001306ca_caseD_9;
  case STMT_RANGE:
    puVar8 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar8 = 0x3f;
    *(position *)(puVar8 + 4) = C->L->current_pos;
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    *(pseudo_t *)(puVar8 + 10) = ppVar9;
    if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) && (ppVar9->type != PSEUDO_VAL)
       ) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = puVar8 + 10;
      *puVar10 = puVar8;
      ptrlist_add((ptr_list **)&ppVar9->users,puVar10,&C->ptrlist_allocator);
    }
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.context);
    *(pseudo_t *)(puVar8 + 0xc) = ppVar9;
    if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) && (ppVar9->type != PSEUDO_VAL)
       ) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = puVar8 + 0xc;
      *puVar10 = puVar8;
      ptrlist_add((ptr_list **)&ppVar9->users,puVar10,&C->ptrlist_allocator);
    }
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_11.range_high);
    *(pseudo_t *)(puVar8 + 0xe) = ppVar9;
    if (((ppVar9 != (pseudo_t)0x0) && (ppVar9->type != PSEUDO_VOID)) && (ppVar9->type != PSEUDO_VAL)
       ) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = puVar8 + 0xe;
      *puVar10 = puVar8;
      ptrlist_add((ptr_list **)&ppVar9->users,puVar10,&C->ptrlist_allocator);
    }
    pbVar13 = ep->active;
    if (pbVar13 != (basic_block *)0x0) {
      *(basic_block **)(puVar8 + 2) = pbVar13;
LAB_001314d5:
      ptrlist_add((ptr_list **)&pbVar13->insns,puVar8,&C->ptrlist_allocator);
    }
    goto switchD_001306ca_caseD_9;
  }
  add_goto(C,ep,pbVar13);
  goto switchD_001306ca_caseD_9;
code_r0x00130692:
  psVar15 = (stmt->field_2).field_5.label_identifier;
  if ((psVar15->field_0x2 & 2) != 0) {
    add_label(C,ep,psVar15);
  }
  stmt = (stmt->field_2).field_3.if_true;
  goto LAB_0013065b;
}

Assistant:

static pseudo_t linearize_statement(struct dmr_C *C, struct entrypoint *ep, struct statement *stmt)
{
	struct basic_block *bb;

	if (!stmt)
		return VOID_PSEUDO(C);

	bb = ep->active;
	if (bb && !bb->insns)
		bb->pos = stmt->pos;
	C->L->current_pos = stmt->pos;

	switch (stmt->type) {
	case STMT_NONE:
		break;

	case STMT_DECLARATION:
		return linearize_declaration(C, ep, stmt);

	case STMT_CONTEXT:
		return linearize_context(C, ep, stmt);

	case STMT_RANGE:
		return linearize_range(C, ep, stmt);

	case STMT_EXPRESSION:
		return linearize_expression(C, ep, stmt->expression);

	case STMT_ASM:
		return linearize_asm_statement(C, ep, stmt);

	case STMT_RETURN:
		return linearize_return(C, ep, stmt);

	case STMT_CASE: {
		add_label(C, ep, stmt->case_label);
		linearize_statement(C, ep, stmt->case_statement);
		break;
	}

	case STMT_LABEL: {
		struct symbol *label = stmt->label_identifier;

		if (label->used) {
			bb = add_label(C, ep, label);
		}
		return 	linearize_statement(C, ep, stmt->label_statement);
	}

	case STMT_GOTO: {
		struct symbol *sym;
		struct expression *expr;
		struct instruction *goto_ins;
		struct basic_block *active;
		pseudo_t pseudo;

		active = ep->active;
		if (!dmrC_bb_reachable(active))
			break;

		if (stmt->goto_label) {
			add_goto(C, ep, get_bound_block(C, ep, stmt->goto_label));
			break;
		}

		expr = stmt->goto_expression;
		if (!expr)
			break;

		/* This can happen as part of simplification */
		if (expr->type == EXPR_LABEL) {
			add_goto(C, ep, get_bound_block(C, ep, expr->label_symbol));
			break;
		}

		pseudo = linearize_expression(C, ep, expr);
		goto_ins = alloc_instruction(C, OP_COMPUTEDGOTO, 0);
		dmrC_use_pseudo(C, goto_ins, pseudo, &goto_ins->target);
		add_one_insn(C, ep, goto_ins);

		FOR_EACH_PTR(stmt->target_list, sym) {
			struct basic_block *bb_computed = get_bound_block(C, ep, sym);
			struct multijmp *jmp = alloc_multijmp(C, bb_computed, 1, 0);
			dmrC_add_multijmp(C, &goto_ins->multijmp_list, jmp);
			dmrC_add_bb(C, &bb_computed->parents, ep->active);
			dmrC_add_bb(C, &active->children, bb_computed);
		} END_FOR_EACH_PTR(sym);

		finish_block(ep);
		break;
	}

	case STMT_COMPOUND:
		if (stmt->inline_fn)
			return linearize_inlined_call(C, ep, stmt);
		return linearize_compound_statement(C, ep, stmt);

	/*
	 * This could take 'likely/unlikely' into account, and
	 * switch the arms around appropriately..
	 */
	case STMT_IF: {
		struct basic_block *bb_true, *bb_false, *endif;
 		struct expression *cond = stmt->if_conditional;

		bb_true = alloc_basic_block(C, ep, stmt->pos);
		bb_false = endif = alloc_basic_block(C, ep, stmt->pos);

 		linearize_cond_branch(C, ep, cond, bb_true, bb_false);

		set_activeblock(C, ep, bb_true);
 		linearize_statement(C, ep, stmt->if_true);
 
 		if (stmt->if_false) {
			endif = alloc_basic_block(C, ep, stmt->pos);
			add_goto(C, ep, endif);
			set_activeblock(C, ep, bb_false);
 			linearize_statement(C, ep, stmt->if_false);
		}
		set_activeblock(C, ep, endif);
		break;
	}

	case STMT_SWITCH:
		return linearize_switch(C, ep, stmt);

	case STMT_ITERATOR:
		return linearize_iterator(C, ep, stmt);

	default:
		break;
	}
	return VOID_PSEUDO(C);
}